

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_52317d::X509Test_TestFromBufferReused_Test::TestBody
          (X509Test_TestFromBufferReused_Test *this)

{
  uint8_t *puVar1;
  size_t sVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  pointer puVar6;
  CRYPTO_BUFFER *__p;
  pointer pcVar7;
  X509 *__p_00;
  pointer pxVar8;
  uint8_t *puVar9;
  size_t sVar10;
  char *in_R9;
  AssertHelper local_350;
  Message local_348;
  undefined1 local_340 [8];
  AssertionResult gtest_ar_5;
  Message local_328;
  int local_320 [2];
  undefined1 local_318 [8];
  AssertionResult gtest_ar_4;
  Message local_300;
  tuple<unsigned_char_*,_bssl::internal::Deleter> local_2f8;
  undefined1 local_2f0 [8];
  AssertionResult gtest_ar_3;
  AssertHelper local_2c0;
  Message local_2b8;
  bool local_2a9;
  undefined1 local_2a8 [8];
  AssertionResult gtest_ar__6;
  UniquePtr<uint8_t> i2d_storage;
  Message local_288;
  int local_27c;
  undefined1 local_278 [8];
  AssertionResult gtest_ar_2;
  pointer puStack_260;
  int i2d_len;
  uint8_t *i2d;
  AssertHelper local_238;
  Message local_230;
  bool local_221;
  undefined1 local_220 [8];
  AssertionResult gtest_ar__5;
  Message local_208;
  undefined1 local_200 [8];
  AssertionResult gtest_ar_1;
  Message local_1e8;
  pointer local_1e0;
  undefined1 local_1d8 [8];
  AssertionResult gtest_ar;
  X509 *ret;
  uint8_t *inp;
  X509 *raw;
  AssertHelper local_190;
  Message local_188;
  int local_17c;
  undefined1 local_178 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_148;
  Message local_140;
  bool local_131;
  undefined1 local_130 [8];
  AssertionResult gtest_ar__3;
  UniquePtr<uint8_t> data2;
  size_t data2_len;
  AssertHelper local_f0;
  Message local_e8;
  undefined1 local_e0 [8];
  AssertionResult gtest_ar__2;
  UniquePtr<X509> root;
  AssertHelper local_a8;
  Message local_a0;
  undefined1 local_98 [8];
  AssertionResult gtest_ar__1;
  UniquePtr<CRYPTO_BUFFER> buf;
  string local_78;
  AssertHelper local_58;
  Message local_50 [3];
  bool local_31;
  undefined1 local_30 [8];
  AssertionResult gtest_ar_;
  UniquePtr<uint8_t> data;
  size_t data_len;
  X509Test_TestFromBufferReused_Test *this_local;
  
  std::unique_ptr<unsigned_char,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<unsigned_char,bssl::internal::Deleter> *)&gtest_ar_.message_);
  local_31 = PEMToDER((UniquePtr<uint8_t> *)&gtest_ar_.message_,(size_t *)&data,
                      "\n-----BEGIN CERTIFICATE-----\nMIICVTCCAb6gAwIBAgIIAj5CwoHlWuYwDQYJKoZIhvcNAQELBQAwLjEaMBgGA1UE\nChMRQm9yaW5nU1NMIFRFU1RJTkcxEDAOBgNVBAMTB1Jvb3QgQ0EwIBcNMTUwMTAx\nMDAwMDAwWhgPMjEwMDAxMDEwMDAwMDBaMC4xGjAYBgNVBAoTEUJvcmluZ1NTTCBU\nRVNUSU5HMRAwDgYDVQQDEwdSb290IENBMIGfMA0GCSqGSIb3DQEBAQUAA4GNADCB\niQKBgQDpDn8RDOZa5oaDcPZRBy4CeBH1siSSOO4mYgLHlPE+oXdqwI/VImi2XeJM\n2uCFETXCknJJjYG0iJdrt/yyRFvZTQZw+QzGj+mz36NqhGxDWb6dstB2m8PX+plZ\nw7jl81MDvUnWs8yiQ/6twgu5AbhWKZQDJKcNKCEpqa6UW0r5nwIDAQABo3oweDAO\nBgNVHQ8BAf8EBAMCAgQwHQYDVR0lBBYwFAYIKwYBBQUHAwEGCCsGAQUFBwMCMA8G\nA1UdEwEB/wQFMAMBAf8wGQYDVR0OBBIEEEA31wH7QC+4HH5UBCeMWQEwGwYDVR0j\nBBQwEoAQQDfXAftAL7gcflQEJ4xZATANBgkqhkiG9w0BAQsFAAOBgQDXylEK77Za\nkKeY6ZerrScWyZhrjIGtHFu09qVpdJEzrk87k2G7iHHR9CAvSofCgEExKtWNS9dN\n+9WiZp/U48iHLk7qaYXdEuO07No4BYtXn+lkOykE+FUxmA4wvOF1cTd2tdj3MzX2\nkfGIBAYhzGZWhY3JbhIfTEfY1PNM1pWChQ==\n-----END CERTIFICATE-----\n"
                     );
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_30,&local_31,(type *)0x0)
  ;
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar3) {
    testing::Message::Message(local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_78,(internal *)local_30,
               (AssertionResult *)"PEMToDER(&data, &data_len, kRootCAPEM)","false","true",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
               ,0xa5b,pcVar5);
    testing::internal::AssertHelper::operator=(&local_58,local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    testing::Message::~Message(local_50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  if (bVar3) {
    puVar6 = std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::get
                       ((unique_ptr<unsigned_char,_bssl::internal::Deleter> *)&gtest_ar_.message_);
    __p = CRYPTO_BUFFER_new(puVar6,(size_t)data._M_t.
                                           super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>
                                           .super__Head_base<0UL,_unsigned_char_*,_false>.
                                           _M_head_impl,(CRYPTO_BUFFER_POOL *)0x0);
    std::unique_ptr<crypto_buffer_st,bssl::internal::Deleter>::
    unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<crypto_buffer_st,bssl::internal::Deleter> *)&gtest_ar__1.message_,__p);
    testing::AssertionResult::
    AssertionResult<std::unique_ptr<crypto_buffer_st,bssl::internal::Deleter>>
              ((AssertionResult *)local_98,
               (unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_,
               (type *)0x0);
    bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
    if (!bVar3) {
      testing::Message::Message(&local_a0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&root,(internal *)local_98,(AssertionResult *)0x86b773,"false","true",
                 in_R9);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0xa5f,pcVar5);
      testing::internal::AssertHelper::operator=(&local_a8,&local_a0);
      testing::internal::AssertHelper::~AssertHelper(&local_a8);
      std::__cxx11::string::~string((string *)&root);
      testing::Message::~Message(&local_a0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
    if (bVar3) {
      pcVar7 = std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::get
                         ((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)
                          &gtest_ar__1.message_);
      __p_00 = X509_parse_from_buffer(pcVar7);
      std::unique_ptr<x509_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
                ((unique_ptr<x509_st,bssl::internal::Deleter> *)&gtest_ar__2.message_,__p_00);
      testing::AssertionResult::AssertionResult<std::unique_ptr<x509_st,bssl::internal::Deleter>>
                ((AssertionResult *)local_e0,
                 (unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar__2.message_,(type *)0x0);
      bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
      if (!bVar3) {
        testing::Message::Message(&local_e8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&data2_len,(internal *)local_e0,(AssertionResult *)0x8b3006,"false",
                   "true",in_R9);
        pcVar5 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_f0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                   ,0xa62,pcVar5);
        testing::internal::AssertHelper::operator=(&local_f0,&local_e8);
        testing::internal::AssertHelper::~AssertHelper(&local_f0);
        std::__cxx11::string::~string((string *)&data2_len);
        testing::Message::~Message(&local_e8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
      if (bVar3) {
        std::unique_ptr<unsigned_char,bssl::internal::Deleter>::
        unique_ptr<bssl::internal::Deleter,void>
                  ((unique_ptr<unsigned_char,bssl::internal::Deleter> *)&gtest_ar__3.message_);
        local_131 = PEMToDER((UniquePtr<uint8_t> *)&gtest_ar__3.message_,(size_t *)&data2,
                             "\n-----BEGIN CERTIFICATE-----\nMIICXjCCAcegAwIBAgIIWjO48ufpunYwDQYJKoZIhvcNAQELBQAwNjEaMBgGA1UE\nChMRQm9yaW5nU1NMIFRFU1RJTkcxGDAWBgNVBAMTD0ludGVybWVkaWF0ZSBDQTAg\nFw0xNTAxMDEwMDAwMDBaGA8yMTAwMDEwMTAwMDAwMFowMjEaMBgGA1UEChMRQm9y\naW5nU1NMIFRFU1RJTkcxFDASBgNVBAMTC2V4YW1wbGUuY29tMIGfMA0GCSqGSIb3\nDQEBAQUAA4GNADCBiQKBgQDD0U0ZYgqShJ7oOjsyNKyVXEHqeafmk/bAoPqY/h1c\noPw2E8KmeqiUSoTPjG5IXSblOxcqpbAXgnjPzo8DI3GNMhAf8SYNYsoH7gc7Uy7j\n5x8bUrisGnuTHqkqH6d4/e7ETJ7i3CpR8bvK16DggEvQTudLipz8FBHtYhFakfdh\nTwIDAQABo3cwdTAOBgNVHQ8BAf8EBAMCBaAwHQYDVR0lBBYwFAYIKwYBBQUHAwEG\nCCsGAQUFBwMCMAwGA1UdEwEB/wQCMAAwGQYDVR0OBBIEEKN5pvbur7mlXjeMEYA0\n4nUwGwYDVR0jBBQwEoAQjBpoqLV2211Xex+NFLIGozANBgkqhkiG9w0BAQsFAAOB\ngQBj/p+JChp//LnXWC1k121LM/ii7hFzQzMrt70bny406SGz9jAjaPOX4S3gt38y\nrhjpPukBlSzgQXFg66y6q5qp1nQTD1Cw6NkKBe9WuBlY3iYfmsf7WT8nhlT1CttU\nxNCwyMX9mtdXdQicOfNjIGUCD5OLV5PgHFPRKiHHioBAhg==\n-----END CERTIFICATE-----\n"
                            );
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_130,&local_131,(type *)0x0);
        bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
        if (!bVar3) {
          testing::Message::Message(&local_140);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__4.message_,(internal *)local_130,
                     (AssertionResult *)"PEMToDER(&data2, &data2_len, kLeafPEM)","false","true",
                     in_R9);
          pcVar5 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_148,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                     ,0xa66,pcVar5);
          testing::internal::AssertHelper::operator=(&local_148,&local_140);
          testing::internal::AssertHelper::~AssertHelper(&local_148);
          std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
          testing::Message::~Message(&local_140);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
        if (bVar3) {
          pxVar8 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::operator->
                             ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar__2.message_)
          ;
          puVar1 = (pxVar8->cert_info->enc).enc;
          pxVar8 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::operator->
                             ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar__2.message_)
          ;
          sVar2 = (pxVar8->cert_info->enc).len;
          pcVar7 = std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::get
                             ((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)
                              &gtest_ar__1.message_);
          puVar9 = CRYPTO_BUFFER_data(pcVar7);
          pcVar7 = std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::get
                             ((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)
                              &gtest_ar__1.message_);
          sVar10 = CRYPTO_BUFFER_len(pcVar7);
          local_17c = buffers_alias(puVar1,sVar2,puVar9,sVar10);
          testing::AssertionResult::AssertionResult<int>
                    ((AssertionResult *)local_178,&local_17c,(type *)0x0);
          bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_178);
          if (!bVar3) {
            testing::Message::Message(&local_188);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&raw,(internal *)local_178,
                       (AssertionResult *)
                       "buffers_alias(root->cert_info->enc.enc, root->cert_info->enc.len, CRYPTO_BUFFER_data(buf.get()), CRYPTO_BUFFER_len(buf.get()))"
                       ,"false","true",in_R9);
            pcVar5 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_190,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                       ,0xa69,pcVar5);
            testing::internal::AssertHelper::operator=(&local_190,&local_188);
            testing::internal::AssertHelper::~AssertHelper(&local_190);
            std::__cxx11::string::~string((string *)&raw);
            testing::Message::~Message(&local_188);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_178);
          inp = (uint8_t *)
                std::unique_ptr<x509_st,_bssl::internal::Deleter>::release
                          ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar__2.message_);
          ret = (X509 *)std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::get
                                  ((unique_ptr<unsigned_char,_bssl::internal::Deleter> *)
                                   &gtest_ar__3.message_);
          gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )d2i_X509((X509 **)&inp,(uchar **)&ret,
                          (long)data2._M_t.
                                super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>._M_t.
                                super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
          std::unique_ptr<x509_st,_bssl::internal::Deleter>::reset
                    ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar__2.message_,
                     (pointer)inp);
          local_1e0 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                 &gtest_ar__2.message_);
          testing::internal::EqHelper::Compare<x509_st_*,_x509_st_*,_nullptr>
                    ((EqHelper *)local_1d8,"root.get()","ret",&local_1e0,
                     (x509_st **)&gtest_ar.message_);
          bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d8);
          if (!bVar3) {
            testing::Message::Message(&local_1e8);
            pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_1d8);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_1.message_,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                       ,0xa75,pcVar5);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_1.message_,&local_1e8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
            testing::Message::~Message(&local_1e8);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d8);
          if (bVar3) {
            pxVar8 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::operator->
                               ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                &gtest_ar__2.message_);
            testing::internal::EqHelper::Compare<crypto_buffer_st>
                      ((EqHelper *)local_200,"nullptr","root->cert_info->enc.buf",(nullptr_t)0x0,
                       (pxVar8->cert_info->enc).buf);
            bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_200);
            if (!bVar3) {
              testing::Message::Message(&local_208);
              pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_200);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar__5.message_,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                         ,0xa76,pcVar5);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar__5.message_,&local_208);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__5.message_);
              testing::Message::~Message(&local_208);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_200);
            if (bVar3) {
              pxVar8 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::operator->
                                 ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                  &gtest_ar__2.message_);
              puVar1 = (pxVar8->cert_info->enc).enc;
              pxVar8 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::operator->
                                 ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                  &gtest_ar__2.message_);
              sVar2 = (pxVar8->cert_info->enc).len;
              pcVar7 = std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::get
                                 ((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)
                                  &gtest_ar__1.message_);
              puVar9 = CRYPTO_BUFFER_data(pcVar7);
              pcVar7 = std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::get
                                 ((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)
                                  &gtest_ar__1.message_);
              sVar10 = CRYPTO_BUFFER_len(pcVar7);
              iVar4 = buffers_alias(puVar1,sVar2,puVar9,sVar10);
              local_221 = iVar4 == 0;
              testing::AssertionResult::AssertionResult<bool>
                        ((AssertionResult *)local_220,&local_221,(type *)0x0);
              bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_220);
              if (!bVar3) {
                testing::Message::Message(&local_230);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&i2d,(internal *)local_220,
                           (AssertionResult *)
                           "buffers_alias(root->cert_info->enc.enc, root->cert_info->enc.len, CRYPTO_BUFFER_data(buf.get()), CRYPTO_BUFFER_len(buf.get()))"
                           ,"true","false",in_R9);
                pcVar5 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_238,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                           ,0xa79,pcVar5);
                testing::internal::AssertHelper::operator=(&local_238,&local_230);
                testing::internal::AssertHelper::~AssertHelper(&local_238);
                std::__cxx11::string::~string((string *)&i2d);
                testing::Message::~Message(&local_230);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_220);
              std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::reset
                        ((unique_ptr<unsigned_char,_bssl::internal::Deleter> *)&gtest_ar__3.message_
                         ,(pointer)0x0);
              puStack_260 = (pointer)0x0;
              pxVar8 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::get
                                 ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                  &gtest_ar__2.message_);
              gtest_ar_2.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_4_ = i2d_X509(pxVar8,&stack0xfffffffffffffda0);
              local_27c = 0;
              testing::internal::CmpHelperGE<int,int>
                        ((internal *)local_278,"i2d_len","0",
                         (int *)((long)&gtest_ar_2.message_._M_t.
                                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                + 4),&local_27c);
              bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_278);
              if (!bVar3) {
                testing::Message::Message(&local_288);
                pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_278);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&i2d_storage,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                           ,0xa81,pcVar5);
                testing::internal::AssertHelper::operator=((AssertHelper *)&i2d_storage,&local_288);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&i2d_storage);
                testing::Message::~Message(&local_288);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_278);
              if (bVar3) {
                std::unique_ptr<unsigned_char,bssl::internal::Deleter>::
                unique_ptr<bssl::internal::Deleter,void>
                          ((unique_ptr<unsigned_char,bssl::internal::Deleter> *)
                           &gtest_ar__6.message_,puStack_260);
                local_2a9 = PEMToDER((UniquePtr<uint8_t> *)&gtest_ar__3.message_,(size_t *)&data2,
                                     "\n-----BEGIN CERTIFICATE-----\nMIICXjCCAcegAwIBAgIIWjO48ufpunYwDQYJKoZIhvcNAQELBQAwNjEaMBgGA1UE\nChMRQm9yaW5nU1NMIFRFU1RJTkcxGDAWBgNVBAMTD0ludGVybWVkaWF0ZSBDQTAg\nFw0xNTAxMDEwMDAwMDBaGA8yMTAwMDEwMTAwMDAwMFowMjEaMBgGA1UEChMRQm9y\naW5nU1NMIFRFU1RJTkcxFDASBgNVBAMTC2V4YW1wbGUuY29tMIGfMA0GCSqGSIb3\nDQEBAQUAA4GNADCBiQKBgQDD0U0ZYgqShJ7oOjsyNKyVXEHqeafmk/bAoPqY/h1c\noPw2E8KmeqiUSoTPjG5IXSblOxcqpbAXgnjPzo8DI3GNMhAf8SYNYsoH7gc7Uy7j\n5x8bUrisGnuTHqkqH6d4/e7ETJ7i3CpR8bvK16DggEvQTudLipz8FBHtYhFakfdh\nTwIDAQABo3cwdTAOBgNVHQ8BAf8EBAMCBaAwHQYDVR0lBBYwFAYIKwYBBQUHAwEG\nCCsGAQUFBwMCMAwGA1UdEwEB/wQCMAAwGQYDVR0OBBIEEKN5pvbur7mlXjeMEYA0\n4nUwGwYDVR0jBBQwEoAQjBpoqLV2211Xex+NFLIGozANBgkqhkiG9w0BAQsFAAOB\ngQBj/p+JChp//LnXWC1k121LM/ii7hFzQzMrt70bny406SGz9jAjaPOX4S3gt38y\nrhjpPukBlSzgQXFg66y6q5qp1nQTD1Cw6NkKBe9WuBlY3iYfmsf7WT8nhlT1CttU\nxNCwyMX9mtdXdQicOfNjIGUCD5OLV5PgHFPRKiHHioBAhg==\n-----END CERTIFICATE-----\n"
                                    );
                testing::AssertionResult::AssertionResult<bool>
                          ((AssertionResult *)local_2a8,&local_2a9,(type *)0x0);
                bVar3 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_2a8);
                if (!bVar3) {
                  testing::Message::Message(&local_2b8);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)&gtest_ar_3.message_,(internal *)local_2a8,
                             (AssertionResult *)"PEMToDER(&data2, &data2_len, kLeafPEM)","false",
                             "true",in_R9);
                  pcVar5 = (char *)std::__cxx11::string::c_str();
                  testing::internal::AssertHelper::AssertHelper
                            (&local_2c0,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                             ,0xa84,pcVar5);
                  testing::internal::AssertHelper::operator=(&local_2c0,&local_2b8);
                  testing::internal::AssertHelper::~AssertHelper(&local_2c0);
                  std::__cxx11::string::~string((string *)&gtest_ar_3.message_);
                  testing::Message::~Message(&local_2b8);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a8);
                if (bVar3) {
                  local_2f8.super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
                       (_Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>)
                       (_Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>)
                       data2._M_t.super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>._M_t
                       .super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
                  testing::internal::EqHelper::Compare<long,_int,_nullptr>
                            ((EqHelper *)local_2f0,"static_cast<long>(data2_len)","i2d_len",
                             (long *)&local_2f8,
                             (int *)((long)&gtest_ar_2.message_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    + 4));
                  bVar3 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_2f0);
                  if (!bVar3) {
                    testing::Message::Message(&local_300);
                    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_2f0)
                    ;
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&gtest_ar_4.message_,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                               ,0xa86,pcVar5);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&gtest_ar_4.message_,&local_300);
                    testing::internal::AssertHelper::~AssertHelper
                              ((AssertHelper *)&gtest_ar_4.message_);
                    testing::Message::~Message(&local_300);
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f0);
                  if (bVar3) {
                    local_320[1] = 0;
                    puVar6 = std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::get
                                       ((unique_ptr<unsigned_char,_bssl::internal::Deleter> *)
                                        &gtest_ar__3.message_);
                    local_320[0] = ::OPENSSL_memcmp(puVar6,puStack_260,
                                                    (long)gtest_ar_2.message_._M_t.
                                                                                                                    
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._4_4_);
                    testing::internal::EqHelper::Compare<int,_int,_nullptr>
                              ((EqHelper *)local_318,"0","OPENSSL_memcmp(data2.get(), i2d, i2d_len)"
                               ,local_320 + 1,local_320);
                    bVar3 = testing::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_318);
                    if (!bVar3) {
                      testing::Message::Message(&local_328);
                      pcVar5 = testing::AssertionResult::failure_message
                                         ((AssertionResult *)local_318);
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&gtest_ar_5.message_,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                                 ,0xa87,pcVar5);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&gtest_ar_5.message_,&local_328);
                      testing::internal::AssertHelper::~AssertHelper
                                ((AssertHelper *)&gtest_ar_5.message_);
                      testing::Message::~Message(&local_328);
                    }
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_318);
                    if (bVar3) {
                      pxVar8 = std::unique_ptr<x509_st,_bssl::internal::Deleter>::operator->
                                         ((unique_ptr<x509_st,_bssl::internal::Deleter> *)
                                          &gtest_ar__2.message_);
                      testing::internal::EqHelper::Compare<crypto_buffer_st>
                                ((EqHelper *)local_340,"nullptr","root->cert_info->enc.buf",
                                 (nullptr_t)0x0,(pxVar8->cert_info->enc).buf);
                      bVar3 = testing::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_340);
                      if (!bVar3) {
                        testing::Message::Message(&local_348);
                        pcVar5 = testing::AssertionResult::failure_message
                                           ((AssertionResult *)local_340);
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_350,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                                   ,0xa88,pcVar5);
                        testing::internal::AssertHelper::operator=(&local_350,&local_348);
                        testing::internal::AssertHelper::~AssertHelper(&local_350);
                        testing::Message::~Message(&local_348);
                      }
                      testing::AssertionResult::~AssertionResult((AssertionResult *)local_340);
                    }
                  }
                }
                std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr
                          ((unique_ptr<unsigned_char,_bssl::internal::Deleter> *)
                           &gtest_ar__6.message_);
              }
            }
          }
        }
        std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<unsigned_char,_bssl::internal::Deleter> *)&gtest_ar__3.message_);
      }
      std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&gtest_ar__2.message_);
    }
    std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_);
  }
  std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<unsigned_char,_bssl::internal::Deleter> *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST(X509Test, TestFromBufferReused) {
  size_t data_len;
  bssl::UniquePtr<uint8_t> data;
  ASSERT_TRUE(PEMToDER(&data, &data_len, kRootCAPEM));

  bssl::UniquePtr<CRYPTO_BUFFER> buf(
      CRYPTO_BUFFER_new(data.get(), data_len, nullptr));
  ASSERT_TRUE(buf);

  bssl::UniquePtr<X509> root(X509_parse_from_buffer(buf.get()));
  ASSERT_TRUE(root);

  size_t data2_len;
  bssl::UniquePtr<uint8_t> data2;
  ASSERT_TRUE(PEMToDER(&data2, &data2_len, kLeafPEM));
  EXPECT_TRUE(buffers_alias(root->cert_info->enc.enc, root->cert_info->enc.len,
                            CRYPTO_BUFFER_data(buf.get()),
                            CRYPTO_BUFFER_len(buf.get())));

  // Historically, this function tested the interaction betweeen
  // |X509_parse_from_buffer| and object reuse. We no longer support object
  // reuse, so |d2i_X509| will replace |raw| with a new object. However, we
  // retain this test to verify that releasing objects from |d2i_X509| works
  // correctly.
  X509 *raw = root.release();
  const uint8_t *inp = data2.get();
  X509 *ret = d2i_X509(&raw, &inp, data2_len);
  root.reset(raw);

  ASSERT_EQ(root.get(), ret);
  ASSERT_EQ(nullptr, root->cert_info->enc.buf);
  EXPECT_FALSE(buffers_alias(root->cert_info->enc.enc, root->cert_info->enc.len,
                             CRYPTO_BUFFER_data(buf.get()),
                             CRYPTO_BUFFER_len(buf.get())));

  // Free |data2| and ensure that |root| took its own copy. Otherwise the
  // following will trigger a use-after-free.
  data2.reset();

  uint8_t *i2d = nullptr;
  int i2d_len = i2d_X509(root.get(), &i2d);
  ASSERT_GE(i2d_len, 0);
  bssl::UniquePtr<uint8_t> i2d_storage(i2d);

  ASSERT_TRUE(PEMToDER(&data2, &data2_len, kLeafPEM));

  ASSERT_EQ(static_cast<long>(data2_len), i2d_len);
  ASSERT_EQ(0, OPENSSL_memcmp(data2.get(), i2d, i2d_len));
  ASSERT_EQ(nullptr, root->cert_info->enc.buf);
}